

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_lsr_16_aw(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_16_fc((int)(short)uVar1,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_write_16_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,uVar2 >> 1);
  m68ki_cpu.n_flag = 0;
  m68ki_cpu.not_z_flag = uVar2 >> 1;
  m68ki_cpu.x_flag = uVar2 << 8;
  m68ki_cpu.c_flag = uVar2 << 8;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_lsr_16_aw(void)
{
	uint ea = EA_AW_16();
	uint src = m68ki_read_16(ea);
	uint res = src >> 1;

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_CLEAR;
	FLAG_Z = res;
	FLAG_C = FLAG_X = src << 8;
	FLAG_V = VFLAG_CLEAR;
}